

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vpu720.c
# Opt level: O0

MPP_RET hal_jpege_vpu720_deinit(void *hal)

{
  MPP_RET MVar1;
  JpegeVpu720HalCtx *ctx;
  MPP_RET ret;
  void *hal_local;
  
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) enter\n","hal_jpege_vpu720_deinit",0xa1);
  }
  jpege_bits_deinit(*(JpegeBits *)((long)hal + 0xf0));
  if (*(long *)((long)hal + 0x70) != 0) {
    mpp_osal_free("hal_jpege_vpu720_deinit",*(void **)((long)hal + 0x70));
  }
  *(undefined8 *)((long)hal + 0x70) = 0;
  if (*(long *)((long)hal + 0x1c8) != 0) {
    mpp_osal_free("hal_jpege_vpu720_deinit",*(void **)((long)hal + 0x1c8));
  }
  *(undefined8 *)((long)hal + 0x1c8) = 0;
  if (*(long *)((long)hal + 0x68) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x68));
    *(undefined8 *)((long)hal + 0x68) = 0;
  }
  if ((*(long *)((long)hal + 0x1c0) != 0) &&
     (MVar1 = mpp_buffer_put_with_caller
                        (*(MppBuffer *)((long)hal + 0x1c0),"hal_jpege_vpu720_deinit"),
     MVar1 != MPP_OK)) {
    _mpp_log_l(2,"hal_jpege_vpu720","put qtbl buffer failed\n","hal_jpege_vpu720_deinit");
  }
  if ((*(long *)((long)hal + 0x1b8) != 0) &&
     (MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x1b8)), MVar1 != MPP_OK)) {
    _mpp_log_l(2,"hal_jpege_vpu720","group free buffer failed\n","hal_jpege_vpu720_deinit");
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) leave\n","hal_jpege_vpu720_deinit",0xba);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_jpege_vpu720_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    JpegeVpu720HalCtx *ctx = (JpegeVpu720HalCtx *)hal;

    hal_jpege_enter();
    jpege_bits_deinit(ctx->bits);

    MPP_FREE(ctx->regs);
    MPP_FREE(ctx->qtbl_sw_buf);

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    if (ctx->qtbl_buffer) {
        ret = mpp_buffer_put(ctx->qtbl_buffer);
        if (ret) {
            mpp_err_f("put qtbl buffer failed\n");
        }
    }

    if (ctx->group) {
        ret = mpp_buffer_group_put(ctx->group);
        if (ret) {
            mpp_err_f("group free buffer failed\n");
        }
    }

    hal_jpege_leave();
    return MPP_OK;
}